

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Impl::requireStructSize
          (Impl *this,uint64_t id,uint dataWordCount,uint pointerCount)

{
  RawSchema **schema;
  RawSchema **local_30;
  RawSchema **_schema2008;
  uint local_20;
  uint local_1c;
  uint pointerCount_local;
  uint dataWordCount_local;
  uint64_t id_local;
  Impl *this_local;
  
  _schema2008._6_2_ = (uint16_t)pointerCount;
  _schema2008._4_2_ = (uint16_t)dataWordCount;
  local_20 = pointerCount;
  local_1c = dataWordCount;
  _pointerCount_local = id;
  id_local = (uint64_t)this;
  kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::
  upsert<capnp::SchemaLoader::Impl::requireStructSize(unsigned_long,unsigned_int,unsigned_int)::__0>
            ((HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize> *)
             &this->structSizeRequirements,id,_schema2008._4_4_,
             (anon_class_1_0_00000001 *)((long)&_schema2008 + 3));
  kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
            ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&schema,(unsigned_long *)&this->schemas)
  ;
  local_30 = kj::_::readMaybe<capnp::_::RawSchema*>((Maybe<capnp::_::RawSchema_*&> *)&schema);
  if (local_30 != (RawSchema **)0x0) {
    applyStructSizeRequirement(this,*local_30,local_1c,local_20);
  }
  return;
}

Assistant:

void SchemaLoader::Impl::requireStructSize(uint64_t id, uint dataWordCount, uint pointerCount) {
  structSizeRequirements.upsert(id, { uint16_t(dataWordCount), uint16_t(pointerCount) },
      [&](RequiredSize& existingValue, RequiredSize&& newValue) {
    existingValue.dataWordCount = kj::max(existingValue.dataWordCount, newValue.dataWordCount);
    existingValue.pointerCount = kj::max(existingValue.pointerCount, newValue.pointerCount);
  });

  KJ_IF_SOME(schema, schemas.find(id)) {
    applyStructSizeRequirement(schema, dataWordCount, pointerCount);
  }
}